

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O2

Value __thiscall xmrig::Hashrate::toJSON(Hashrate *this,size_t threadId,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  long in_RCX;
  undefined8 extraout_RDX;
  double dVar1;
  Value VVar2;
  Data local_38;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RCX + 0x10);
  this->m_threads = 0;
  this->m_top = (uint32_t *)0x0;
  *(undefined2 *)((long)&this->m_top + 6) = 4;
  dVar1 = calc((Hashrate *)threadId,(size_t)doc,10000);
  if ((uint)((long)ABS(dVar1) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    dVar1 = floor(dVar1 * 100.0);
    local_38._8_6_ = 0;
    local_38.n = (Number)(dVar1 * 0.01);
    local_38.f.flags = 0x216;
  }
  else {
    local_38.ss.str = SUB1614((undefined1  [16])0x0,0);
    local_38.f.flags = 0;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_38.s,allocator);
  dVar1 = calc((Hashrate *)threadId,(size_t)doc,60000);
  if ((uint)((long)ABS(dVar1) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    dVar1 = floor(dVar1 * 100.0);
    local_38._8_6_ = 0;
    local_38.n = (Number)(dVar1 * 0.01);
    local_38.f.flags = 0x216;
  }
  else {
    local_38.ss.str = SUB1614((undefined1  [16])0x0,0);
    local_38.f.flags = 0;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_38.s,allocator);
  dVar1 = calc((Hashrate *)threadId,(size_t)doc,900000);
  if ((uint)((long)ABS(dVar1) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    dVar1 = floor(dVar1 * 100.0);
    local_38._8_6_ = 0;
    local_38.n = (Number)(dVar1 * 0.01);
    local_38.f.flags = 0x216;
  }
  else {
    local_38.ss.str = SUB1614((undefined1  [16])0x0,0);
    local_38.f.flags = 0;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_38.s,allocator);
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Hashrate::toJSON(size_t threadId, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);
    out.PushBack(normalize(calc(threadId, ShortInterval)),  allocator);
    out.PushBack(normalize(calc(threadId, MediumInterval)), allocator);
    out.PushBack(normalize(calc(threadId, LargeInterval)),  allocator);

    return out;
}